

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O2

UDataMemory *
checkDataItem(DataHeader *pHeader,UDataMemoryIsAcceptable *isAcceptable,void *context,char *type,
             char *name,UErrorCode *nonFatalErr,UErrorCode *fatalErr)

{
  UBool UVar1;
  UDataMemory *pUVar2;
  
  if (*fatalErr < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((((pHeader->dataHeader).magic1 == 0xda) && ((pHeader->dataHeader).magic2 == '\'')) &&
       ((isAcceptable == (UDataMemoryIsAcceptable *)0x0 ||
        (UVar1 = (*isAcceptable)(context,type,name,&pHeader->info), UVar1 != '\0')))) {
      pUVar2 = UDataMemory_createNewInstance_63(fatalErr);
      if (*fatalErr < U_ILLEGAL_ARGUMENT_ERROR) {
        pUVar2->pHeader = pHeader;
        return pUVar2;
      }
    }
    else {
      *nonFatalErr = U_INVALID_FORMAT_ERROR;
    }
  }
  return (UDataMemory *)0x0;
}

Assistant:

static UDataMemory *
checkDataItem
(
 const DataHeader         *pHeader,         /* The data item to be checked.                */
 UDataMemoryIsAcceptable  *isAcceptable,    /* App's call-back function                    */
 void                     *context,         /*   pass-thru param for above.                */
 const char               *type,            /*   pass-thru param for above.                */
 const char               *name,            /*   pass-thru param for above.                */
 UErrorCode               *nonFatalErr,     /* Error code if this data was not acceptable  */
                                            /*   but openChoice should continue with       */
                                            /*   trying to get data from fallback path.    */
 UErrorCode               *fatalErr         /* Bad error, caller should return immediately */
 )
{
    UDataMemory  *rDataMem = NULL;          /* the new UDataMemory, to be returned.        */

    if (U_FAILURE(*fatalErr)) {
        return NULL;
    }

    if(pHeader->dataHeader.magic1==0xda &&
        pHeader->dataHeader.magic2==0x27 &&
        (isAcceptable==NULL || isAcceptable(context, type, name, &pHeader->info))
    ) {
        rDataMem=UDataMemory_createNewInstance(fatalErr);
        if (U_FAILURE(*fatalErr)) {
            return NULL;
        }
        rDataMem->pHeader = pHeader;
    } else {
        /* the data is not acceptable, look further */
        /* If we eventually find something good, this errorcode will be */
        /*    cleared out.                                              */
        *nonFatalErr=U_INVALID_FORMAT_ERROR;
    }
    return rDataMem;
}